

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O0

void __thiscall
TPZCompElH1<pzshape::TPZShapeLinear>::InitMaterialData
          (TPZCompElH1<pzshape::TPZShapeLinear> *this,TPZMaterialData *data)

{
  int iVar1;
  uint uVar2;
  TPZGeoEl *this_00;
  int64_t iVar3;
  undefined4 extraout_var;
  TPZVec<double> *pTVar4;
  _func_int **pp_Var5;
  undefined4 extraout_var_00;
  TPZManVector<int,_3> *this_01;
  long *in_RSI;
  TPZGeoElSide *in_RDI;
  TPZGeoElSide gelside;
  uint64_t ducol;
  uint64_t durow;
  uint64_t ulen;
  int nstate;
  int nshape;
  int dim;
  TPZShapeData *shapedata;
  int i_1;
  int i;
  TPZGeoEl *gel;
  TPZManVector<int,_2> sideorient;
  TPZManVector<int,_3> orders;
  TPZManVector<long,_2> ids;
  TPZMatSingleSpace *mat;
  TPZCompEl *in_stack_fffffffffffffe98;
  TPZGeoEl *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  byte in_stack_fffffffffffffeb7;
  TPZFMatrix<double> *in_stack_fffffffffffffeb8;
  TPZManVector<double,_3> *in_stack_fffffffffffffec0;
  TPZVec<double> *Xcenter;
  undefined4 local_f8 [2];
  undefined4 local_f0 [2];
  undefined4 local_e8 [3];
  int local_dc;
  undefined4 local_d8;
  int local_d4;
  uint local_c8;
  int local_c4;
  TPZGeoEl *local_c0;
  undefined4 local_b4;
  TPZVec<int> local_78;
  TPZShapeData *in_stack_ffffffffffffffb0;
  TPZVec<int> *in_stack_ffffffffffffffb8;
  TPZVec<long> *in_stack_ffffffffffffffc0;
  undefined4 extraout_var_01;
  
  this_00 = TPZCompEl::Reference(in_stack_fffffffffffffe98);
  iVar3 = TPZGeoEl::Id(this_00);
  *(int *)(in_RSI + 0x857) = (int)iVar3;
  iVar1 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x17])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    pTVar4 = (TPZVec<double> *)0x0;
  }
  else {
    pTVar4 = (TPZVec<double> *)
             __dynamic_cast(CONCAT44(extraout_var,iVar1),&TPZMaterial::typeinfo,
                            &TPZMatSingleSpace::typeinfo,0xfffffffffffffffe);
  }
  Xcenter = pTVar4;
  TPZManVector<long,_2>::TPZManVector
            ((TPZManVector<long,_2> *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
             (int64_t)in_stack_fffffffffffffea8);
  TPZManVector<int,_3>::TPZManVector
            ((TPZManVector<int,_3> *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
             (int64_t)in_stack_fffffffffffffea8);
  local_b4 = 0;
  TPZManVector<int,_2>::TPZManVector
            ((TPZManVector<int,_2> *)in_stack_fffffffffffffec0,(int64_t)in_stack_fffffffffffffeb8,
             (int *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  local_c0 = TPZCompEl::Reference(in_stack_fffffffffffffe98);
  for (local_c4 = 0; local_c4 < 2; local_c4 = local_c4 + 1) {
    pp_Var5 = (_func_int **)(**(code **)(*(long *)local_c0 + 0xa8))(local_c0,local_c4);
    in_stack_fffffffffffffec0 =
         (TPZManVector<double,_3> *)
         TPZVec<long>::operator[]((TPZVec<long> *)&stack0xffffffffffffffb8,(long)local_c4);
    (in_stack_fffffffffffffec0->super_TPZVec<double>)._vptr_TPZVec = pp_Var5;
  }
  for (local_c8 = 2; (int)local_c8 < 3; local_c8 = local_c8 + 1) {
    iVar1 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x15])(in_RDI,(ulong)local_c8);
    in_stack_fffffffffffffeb8 = (TPZFMatrix<double> *)CONCAT44(extraout_var_00,iVar1);
    in_stack_fffffffffffffeb7 = TPZConnect::Order((TPZConnect *)in_stack_fffffffffffffeb8);
    uVar2 = (uint)in_stack_fffffffffffffeb7;
    in_stack_fffffffffffffea8 =
         (TPZGeoEl *)TPZVec<int>::operator[](&local_78,(long)(int)local_c8 + -2);
    *(uint *)in_stack_fffffffffffffea8 = uVar2;
  }
  TPZShapeH1<pzshape::TPZShapeLinear>::Initialize
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  (*pTVar4->_vptr_TPZVec[9])(pTVar4,in_RSI);
  local_d4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x16])();
  iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RSI + 0x454));
  local_d8 = (undefined4)iVar3;
  iVar1 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x17])();
  this_01 = (TPZManVector<int,_3> *)CONCAT44(extraout_var_01,iVar1);
  local_dc = (*(this_01->super_TPZVec<int>)._vptr_TPZVec[0xf])();
  *(undefined4 *)(in_RSI + 1) = 1;
  TPZFMatrix<double>::Redim
            (in_stack_fffffffffffffeb8,CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0)
             ,(int64_t)in_stack_fffffffffffffea8);
  TPZFMatrix<double>::Redim
            (in_stack_fffffffffffffeb8,CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0)
             ,(int64_t)in_stack_fffffffffffffea8);
  TPZFMatrix<double>::Redim
            (in_stack_fffffffffffffeb8,CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0)
             ,(int64_t)in_stack_fffffffffffffea8);
  TPZFMatrix<double>::Redim
            (in_stack_fffffffffffffeb8,CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0)
             ,(int64_t)in_stack_fffffffffffffea8);
  TPZFMatrix<double>::Redim
            (in_stack_fffffffffffffeb8,CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0)
             ,(int64_t)in_stack_fffffffffffffea8);
  TPZManVector<double,_3>::Resize(in_stack_fffffffffffffec0,(int64_t)in_stack_fffffffffffffeb8);
  if ((*(byte *)(in_RSI + 0x71f) & 1) != 0) {
    (*pTVar4->_vptr_TPZVec[0xc])(pTVar4,local_e8,local_f0,local_f8);
    (**(code **)(*in_RSI + 0x50))(in_RSI,local_dc,local_e8[0],local_f0[0],local_f8[0]);
  }
  if ((*(byte *)((long)in_RSI + 0x38fb) & 1) != 0) {
    TPZGeoElSide::TPZGeoElSide
              ((TPZGeoElSide *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffea8);
    TPZGeoElSide::CenterX(in_RDI,Xcenter);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1c03195);
  }
  TPZManVector<int,_2>::~TPZManVector((TPZManVector<int,_2> *)this_01);
  TPZManVector<int,_3>::~TPZManVector(this_01);
  TPZManVector<long,_2>::~TPZManVector((TPZManVector<long,_2> *)this_01);
  return;
}

Assistant:

void TPZCompElH1<TSHAPE>::InitMaterialData(TPZMaterialData &data){
  data.gelElId = this->Reference()->Id();
    auto *mat =
        dynamic_cast<TPZMatSingleSpace*>(this->Material());
#ifdef PZDEBUG
    if(!mat)
    {
        DebugStop();
    }
#endif
    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(TSHAPE::NCornerNodes);
    TPZManVector<int,TSHAPE::NSides> orders(TSHAPE::NSides-TSHAPE::NCornerNodes);
    TPZManVector<int,TSHAPE::NFacets> sideorient(TSHAPE::NFacets,0);
    TPZGeoEl *gel = this->Reference();
    for(int i=0; i<TSHAPE::NCornerNodes; i++) ids[i] = gel->NodeIndex(i);
    for(int i=TSHAPE::NCornerNodes; i<TSHAPE::NSides; i++) orders[i-TSHAPE::NCornerNodes] = this->Connect(i).Order();
    TPZShapeData &shapedata = data;
    TPZShapeH1<TSHAPE>::Initialize(ids, orders, shapedata);
    mat->FillDataRequirements(data);
    const int dim = this->Dimension();
    const int nshape = data.fPhi.Rows();
    const int nstate = this->Material()->NStateVariables();
    data.fShapeType = TPZMaterialData::EScalarShape;
    data.phi.Redim(nshape,1);
//    data.dphi.Redim(dim,nshape);
    data.dphix.Redim(dim,nshape);
    data.axes.Redim(dim,3);
    data.jacobian.Redim(dim,dim);
    data.jacinv.Redim(dim,dim);
    data.x.Resize(3);
    if (data.fNeedsSol){
        uint64_t ulen,durow,ducol;
        mat->GetSolDimensions(ulen,durow,ducol);
        data.SetSolSizes(nstate, ulen, durow, ducol);
    }
    if(data.fNeedsNeighborCenter)
    {
        TPZGeoElSide gelside(gel);
        gelside.CenterX(data.XCenter);
    }
    
}